

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O1

LispPTR N_OP_getbasebyte(LispPTR base_addr,LispPTR byteoffset)

{
  ulong uVar1;
  
  uVar1 = (ulong)byteoffset;
  if ((byteoffset & 0xfff0000) == 0xf0000) {
    uVar1 = (ulong)(byteoffset | 0xffff0000);
  }
  else if ((byteoffset & 0xfff0000) == 0xe0000) {
    uVar1 = uVar1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(byteoffset >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = byteoffset;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((byteoffset & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
    }
    uVar1 = (ulong)*(uint *)(Lisp_world + uVar1);
  }
  return *(byte *)((long)Lisp_world + uVar1 + (ulong)(base_addr & 0xfffffff) * 2 ^ 3) | 0xe0000;
}

Assistant:

LispPTR N_OP_getbasebyte(LispPTR base_addr, LispPTR byteoffset) {
  switch ((SEGMASK & byteoffset)) {
    case S_POSITIVE: byteoffset = byteoffset & 0x0000FFFF; break;
    case S_NEGATIVE: byteoffset = byteoffset | 0xFFFF0000; break;
    default:
      switch ((GetTypeNumber(byteoffset))) {
        case TYPE_FIXP: byteoffset = *((int *)NativeAligned4FromLAddr(byteoffset)); break;
        default: /* floatp also fall thru */ ERROR_EXIT(byteoffset);
      } /* end switch */
      break;
  } /* end switch */
  return ((0xFF & (GETBYTE((char *)NativeAligned2FromLAddr((POINTERMASK & base_addr)) + byteoffset))) |
          S_POSITIVE);
}